

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O3

void __thiscall Person::Person(Person *this,string *name,string *id,Address *address)

{
  pointer pcVar1;
  
  this->_vptr_Person = (_func_int **)&PTR_validate_00107d20;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->id,pcVar1,pcVar1 + id->_M_string_length);
  Address::Address(&this->address,address);
  (**this->_vptr_Person)(this);
  return;
}

Assistant:

Person::Person(const string &name, const string &id, const Address &address) :
        name(name), id(id), address(address) { validate(); }